

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

HRESULT __thiscall
Js::ScriptContext::TryDeserializeParserState
          (ScriptContext *this,ULONG grfscr,uint sourceCRC,charcount_t cchLength,SRCINFO *srcInfo,
          Utf8SourceInfo *utf8SourceInfo,uint *sourceIndex,bool isCesu8,NativeModule *nativeModule,
          ParseableFunctionInfo **func,byte **parserStateCacheBuffer,
          DWORD *parserStateCacheByteCount,SimpleDataCacheWrapper *pDataCache)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HRESULT hr;
  bool isCesu8_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  SRCINFO *srcInfo_local;
  charcount_t cchLength_local;
  uint sourceCRC_local;
  ULONG grfscr_local;
  ScriptContext *this_local;
  
  if (pDataCache == (SimpleDataCacheWrapper *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x859,"(pDataCache != nullptr)","pDataCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (func == (ParseableFunctionInfo **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x85a,"(func != nullptr)","func != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (parserStateCacheBuffer == (byte **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x85b,"(parserStateCacheBuffer != nullptr)",
                                "parserStateCacheBuffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (parserStateCacheByteCount == (DWORD *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x85c,"(parserStateCacheByteCount != nullptr)",
                                "parserStateCacheByteCount != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *func = (ParseableFunctionInfo *)0x0;
  *parserStateCacheBuffer = (byte *)0x0;
  *parserStateCacheByteCount = 0;
  return -0x7fffbffb;
}

Assistant:

HRESULT ScriptContext::TryDeserializeParserState(
        _In_ ULONG grfscr,
        _In_ uint sourceCRC,
        _In_ charcount_t cchLength,
        _In_ SRCINFO *srcInfo,
        _In_ Js::Utf8SourceInfo* utf8SourceInfo,
        _Inout_ uint& sourceIndex,
        _In_ bool isCesu8,
        _In_opt_ NativeModule* nativeModule,
        _Outptr_ Js::ParseableFunctionInfo ** func,
        _Outptr_result_buffer_(*parserStateCacheByteCount) byte** parserStateCacheBuffer,
        _Out_ DWORD* parserStateCacheByteCount,
        _In_ Js::SimpleDataCacheWrapper* pDataCache)
    {
        HRESULT hr = E_FAIL;

        Assert(pDataCache != nullptr);
        Assert(func != nullptr);
        Assert(parserStateCacheBuffer != nullptr);
        Assert(parserStateCacheByteCount != nullptr);

        *func = nullptr;
        *parserStateCacheBuffer = nullptr;
        *parserStateCacheByteCount = 0;

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        // Find the parser state block in the read stream and get the size of the block in bytes.
        ULONG blockByteCount = 0;
        DebugOnly(auto url = !srcInfo->sourceContextInfo->isHostDynamicDocument ? srcInfo->sourceContextInfo->url : this->GetUrl());

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Trying to read parser state cache for '%s'\n"), url);

        hr = pDataCache->SeekReadStreamToBlock(SimpleDataCacheWrapper::BlockType_ParserState, &blockByteCount);
        if (FAILED(hr))
        {
            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to find parser state cache in the stream (hr = 0x%08lx) for '%s'\n"), hr, url);
            return hr;
        }

        uint expectedCRC = 0;
        hr = pDataCache->Read(&expectedCRC);
        if (FAILED(hr))
        {
            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to read CRC value (hr = 0x%08lx) for '%s'\n"), hr, url);
            return hr;
        }

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Computed CRC value = 0x%08lx (expected CRC value = 0x%08lx) for '%s'\n"), sourceCRC, expectedCRC, url);

        if (expectedCRC != sourceCRC)
        {
            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Fail CRC check, discarding parser state cache for '%s'\n"), url);
            return E_FAIL;
        }

        // The block includes a 4-byte CRC before the parser state cache.
        ULONG compressedBufferByteCount = blockByteCount - sizeof(uint);

        // The contract for this bytecode buffer is that it is available as long as we have this ScriptContext.
        // We will use this buffer as the string table needed to back the deferred stubs as well as bytecode
        // for defer deserialized functions.
        // TODO: This, better.
        ArenaAllocator* alloc = this->SourceCodeAllocator();
        size_t decompressedBufferByteCount = 0;
        byte* decompressedBuffer = nullptr;

        if (CONFIG_FLAG(CompressParserStateCache))
        {
            BEGIN_TEMP_ALLOCATOR(tempAllocator, this, _u("ByteCodeSerializer"));
            {
                byte* compressedBuffer = AnewNoThrowArray(tempAllocator, byte, compressedBufferByteCount);
                if (compressedBuffer == nullptr)
                {
                    hr = E_FAIL;
                    goto ExitTempAllocator;
                }

                hr = pDataCache->ReadArray(compressedBuffer, compressedBufferByteCount);
                if (FAILED(hr))
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to read compressed parser state cache (wanted %lu bytes) (hr = 0x%08lx) for '%s'\n"), compressedBufferByteCount, hr, url);
                    goto ExitTempAllocator;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Successfully read compressed parser state cache (%lu bytes) for '%s'\n"), compressedBufferByteCount, url);

                hr = Js::CompressionUtilities::DecompressBuffer(alloc, compressedBuffer, compressedBufferByteCount, &decompressedBuffer, &decompressedBufferByteCount);
                if (FAILED(hr))
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to decompress parser state cache (hr = 0x%08lx) for '%s'\n"), hr, url);
                    goto ExitTempAllocator;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Decompressed parser state cache %lu -> %lu bytes (%.2f%%) to stream for '%s'\n"), compressedBufferByteCount, decompressedBufferByteCount, (double)compressedBufferByteCount / decompressedBufferByteCount * 100.0, url);
            }
ExitTempAllocator:
            END_TEMP_ALLOCATOR(tempAllocator, this);

            if (FAILED(hr))
            {
                goto Error;
            }
        }
        else
        {
            // We didn't compress the parser state cache so don't decompress it, just read the buffer.
            decompressedBuffer = AnewNoThrowArray(alloc, byte, compressedBufferByteCount);
            decompressedBufferByteCount = compressedBufferByteCount;
            if (decompressedBuffer == nullptr)
            {
                return E_FAIL;
            }

            hr = pDataCache->ReadArray(decompressedBuffer, compressedBufferByteCount);
            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to read parser state cache (wanted %lu bytes) (hr = 0x%08lx) for '%s'\n"), decompressedBufferByteCount, hr, url);
                goto Error;
            }
        }

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Successfully read parser state cache (%lu bytes) for '%s'\n"), decompressedBufferByteCount, url);

        if (utf8SourceInfo != nullptr)
        {
            // We are not going to parse the source when we have the parser state cache available so we
            // need to setup the source info for the defer-parse functions we'll hydrate from the cache.
            // Note: Since we didn't parse the code we won't be able to correct the source length like
            // we would have if we had parsed the UTF8 code and discovered the actual number of characters.
            // If this is necessary, we can probably use the Utf8Codex to count the characters in
            // the source.
            utf8SourceInfo->SetParseFlags(grfscr);
            sourceIndex = this->SaveSourceNoCopy(utf8SourceInfo, cchLength, isCesu8);
            utf8SourceInfo->SetByteCodeGenerationFlags(grfscr);
        }

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Trying to deserialize parser state cache for '%s'\n"), url);

        FunctionBody* functionBody = nullptr;
        hr = Js::ByteCodeSerializer::DeserializeFromBuffer(this, grfscr, (ISourceHolder*) nullptr, srcInfo, decompressedBuffer, nativeModule, &functionBody, sourceIndex);

        if (FAILED(hr))
        {
            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to deserialize parser state cache (hr = 0x%08lx) for '%s'\n"), hr, url);
            goto Error;
        }

        OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Successfully deserialized parser state cache for '%s'\n"), url);

        *func = functionBody->GetParseableFunctionInfo();
        *parserStateCacheBuffer = decompressedBuffer;
        *parserStateCacheByteCount = (DWORD)decompressedBufferByteCount;
Error:
        if (FAILED(hr) && decompressedBuffer != nullptr)
        {
            AdeleteArray(alloc, decompressedBufferByteCount, decompressedBuffer);
        }
#endif

        return hr;
    }